

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O2

mk_rconf_section * mk_rconf_section_add(mk_rconf *conf,char *name)

{
  mk_list *pmVar1;
  mk_rconf_section *pmVar2;
  char *pcVar3;
  
  pmVar2 = (mk_rconf_section *)mk_mem_alloc(0x28);
  if (pmVar2 != (mk_rconf_section *)0x0) {
    pcVar3 = mk_string_dup(name);
    pmVar2->name = pcVar3;
    (pmVar2->entries).next = &pmVar2->entries;
    (pmVar2->entries).prev = &pmVar2->entries;
    pmVar1 = (conf->sections).prev;
    (conf->sections).prev = &pmVar2->_head;
    (pmVar2->_head).next = &conf->sections;
    (pmVar2->_head).prev = pmVar1;
    pmVar1->next = &pmVar2->_head;
  }
  return pmVar2;
}

Assistant:

struct mk_rconf_section *mk_rconf_section_add(struct mk_rconf *conf,
                                              char *name)
{
    struct mk_rconf_section *new;

    /* Alloc section node */
    new = mk_mem_alloc(sizeof(struct mk_rconf_section));
    if (!new) {
        return NULL;
    }
    new->name = mk_string_dup(name);
    mk_list_init(&new->entries);
    mk_list_add(&new->_head, &conf->sections);

    return new;
}